

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::detail::write_buffer<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,buffer<char> *buf)

{
  long value;
  type tVar1;
  type local_40;
  unsigned_streamsize n;
  unsigned_streamsize max_size;
  unsigned_streamsize size;
  char *buf_data;
  buffer<char> *buf_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  size = (unsigned_streamsize)buffer<char>::data(buf);
  max_size = buffer<char>::size(buf);
  value = max_value<long>();
  tVar1 = to_unsigned<long>(value);
  do {
    local_40 = tVar1;
    if (max_size <= tVar1) {
      local_40 = max_size;
    }
    std::ostream::write((char *)os,size);
    size = local_40 + size;
    max_size = max_size - local_40;
  } while (max_size != 0);
  return;
}

Assistant:

void write_buffer(std::basic_ostream<Char>& os, buffer<Char>& buf) {
  const Char* buf_data = buf.data();
  using unsigned_streamsize = std::make_unsigned<std::streamsize>::type;
  unsigned_streamsize size = buf.size();
  unsigned_streamsize max_size = to_unsigned(max_value<std::streamsize>());
  do {
    unsigned_streamsize n = size <= max_size ? size : max_size;
    os.write(buf_data, static_cast<std::streamsize>(n));
    buf_data += n;
    size -= n;
  } while (size != 0);
}